

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_keydata.cpp
# Opt level: O0

void __thiscall KeyData_DerivePubkey_Test::TestBody(KeyData_DerivePubkey_Test *this)

{
  allocator<unsigned_int> *paVar1;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  AssertionResult gtest_ar_1;
  CfdException *e_1;
  KeyData local_a78;
  KeyData local_8f0;
  undefined1 local_768 [8];
  KeyData obj2;
  anon_class_1_0_00000001 check_func2;
  AssertionResult gtest_ar;
  CfdException *e;
  KeyData local_590;
  KeyData local_408;
  undefined1 local_280 [8];
  KeyData obj1;
  uint local_f0;
  anon_class_1_0_00000001 check_func;
  undefined4 uStack_ec;
  undefined1 local_d8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> array2;
  uint local_b8 [8];
  iterator local_98;
  size_type local_90;
  undefined1 local_88 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> array1;
  string local_68 [8];
  string path;
  allocator local_31;
  undefined1 local_30 [8];
  string key1;
  KeyData_DerivePubkey_Test *this_local;
  
  key1.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,
             "[3456789a/1h/2/3h]tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_68,"1/2",
             (allocator *)
             ((long)&array1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&array1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_b8[0] = 0x80000001;
  local_b8[1] = 2;
  local_b8[2] = 0x80000003;
  local_b8[3] = 1;
  local_b8[4] = 2;
  local_98 = local_b8;
  local_90 = 5;
  paVar1 = (allocator<unsigned_int> *)
           ((long)&array2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_int>::allocator(paVar1);
  __l_00._M_len = local_90;
  __l_00._M_array = local_98;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,__l_00,paVar1);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&array2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_f0 = 1;
  uStack_ec = 2;
  paVar1 = (allocator<unsigned_int> *)
           ((long)&obj1.fingerprint_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_int>::allocator(paVar1);
  __l._M_len = 2;
  __l._M_array = &local_f0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,__l,paVar1);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&obj1.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::KeyData::KeyData((KeyData *)local_280);
  cfd::core::KeyData::KeyData(&local_408,(string *)local_30,-1,false);
  cfd::core::KeyData::operator=((KeyData *)local_280,&local_408);
  cfd::core::KeyData::~KeyData(&local_408);
  std::__cxx11::string::string((string *)&e,local_68);
  cfd::core::KeyData::DerivePubkey(&local_590,(KeyData *)local_280,(string *)&e,false);
  cfd::core::KeyData::operator=((KeyData *)local_280,&local_590);
  cfd::core::KeyData::~KeyData(&local_590);
  std::__cxx11::string::~string((string *)&e);
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             ((long)&obj1.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 6),(KeyData *)local_280,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
  cfd::core::KeyData::KeyData((KeyData *)local_768);
  cfd::core::KeyData::KeyData(&local_8f0,(string *)local_30,-1,false);
  cfd::core::KeyData::operator=((KeyData *)local_768,&local_8f0);
  cfd::core::KeyData::~KeyData(&local_8f0);
  std::__cxx11::string::string((string *)&e_1,local_68);
  cfd::core::KeyData::DerivePubkey(&local_a78,(KeyData *)local_768,(string *)&e_1,true);
  cfd::core::KeyData::operator=((KeyData *)local_768,&local_a78);
  cfd::core::KeyData::~KeyData(&local_a78);
  std::__cxx11::string::~string((string *)&e_1);
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             ((long)&obj2.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7),(KeyData *)local_768,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8);
  cfd::core::KeyData::~KeyData((KeyData *)local_768);
  cfd::core::KeyData::~KeyData((KeyData *)local_280);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(KeyData, DerivePubkey) {
  std::string key1 = "[3456789a/1h/2/3h]tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua";
  std::string path = "1/2";
  std::vector<uint32_t> array1{0x80000001, 2, 0x80000003, 1, 2};
  std::vector<uint32_t> array2{1, 2};

  auto check_func = [](const KeyData& obj, const std::vector<uint32_t>& arr_obj) {
    auto obj_arr = obj.GetChildNumArray();
    EXPECT_TRUE(obj.IsValid());
    EXPECT_FALSE(obj.HasPrivkey());
    EXPECT_TRUE(obj.HasExtPubkey());
    EXPECT_FALSE(obj.HasExtPrivkey());
    EXPECT_EQ(arr_obj.size(), obj_arr.size());
    EXPECT_STREQ("1'/2/3'/1/2", obj.GetBip32Path().c_str());
    EXPECT_STREQ("3456789a", obj.GetFingerprint().GetHex().c_str());
    EXPECT_STREQ(
        "tpubDKETJ63aebYdrKgfJg1fAQXgiNX9WGC4YyAGU3o5F9xhqx3Q2Y2Qnn9d3LPG5wfajojW4PGmdcFJCGJaCL8mjcTAS2aD7uBS34zL5diACGD",
        obj.GetExtPubkey().ToString().c_str());
    EXPECT_STREQ(
        "038e04e1ba2657af7032efd287da4feaf47ac06bd18380595ae96bd626e8c2ad89",
        obj.GetPubkey().GetHex().c_str());
    for (size_t idx=0; idx<arr_obj.size(); ++idx) {
      EXPECT_EQ(arr_obj[idx], obj_arr[idx]);
    }
    EXPECT_STREQ(
        "[3456789a/1'/2/3'/1/2]038e04e1ba2657af7032efd287da4feaf47ac06bd18380595ae96bd626e8c2ad89",
        obj.ToString().c_str());
    EXPECT_STREQ("0x80000001/0x2/0x80000003/0x1/0x2",
        obj.GetBip32Path(HardenedType::kNumber, true).c_str());

    EXPECT_STREQ(
        "[3456789a/1h/2/3h/1/2]tpubDKETJ63aebYdrKgfJg1fAQXgiNX9WGC4YyAGU3o5F9xhqx3Q2Y2Qnn9d3LPG5wfajojW4PGmdcFJCGJaCL8mjcTAS2aD7uBS34zL5diACGD",
        obj.ToString(false, HardenedType::kSmallH).c_str());
  };

  KeyData obj1;
  try {
    obj1 = KeyData(key1);
    obj1 = obj1.DerivePubkey(path, false);
    check_func(obj1, array1);
  } catch (const CfdException& e) {
    EXPECT_STREQ("", e.what());
  }

  auto check_func2 = [](const KeyData& obj, const std::vector<uint32_t>& arr_obj) {
    auto obj_arr = obj.GetChildNumArray();
    EXPECT_TRUE(obj.IsValid());
    EXPECT_FALSE(obj.HasPrivkey());
    EXPECT_TRUE(obj.HasExtPubkey());
    EXPECT_FALSE(obj.HasExtPrivkey());
    EXPECT_EQ(arr_obj.size(), obj_arr.size());
    EXPECT_STREQ("1/2", obj.GetBip32Path().c_str());
    EXPECT_STREQ("40c902dd", obj.GetFingerprint().GetHex().c_str());
    EXPECT_STREQ(
        "tpubDKETJ63aebYdrKgfJg1fAQXgiNX9WGC4YyAGU3o5F9xhqx3Q2Y2Qnn9d3LPG5wfajojW4PGmdcFJCGJaCL8mjcTAS2aD7uBS34zL5diACGD",
        obj.GetExtPubkey().ToString().c_str());
    EXPECT_STREQ(
        "038e04e1ba2657af7032efd287da4feaf47ac06bd18380595ae96bd626e8c2ad89",
        obj.GetPubkey().GetHex().c_str());
    for (size_t idx=0; idx<arr_obj.size(); ++idx) {
      EXPECT_EQ(arr_obj[idx], obj_arr[idx]);
    }
    EXPECT_STREQ(
        "[40c902dd/1/2]038e04e1ba2657af7032efd287da4feaf47ac06bd18380595ae96bd626e8c2ad89",
        obj.ToString().c_str());
    EXPECT_STREQ("0x1/0x2",
        obj.GetBip32Path(HardenedType::kNumber, true).c_str());

    EXPECT_STREQ(
        "[40c902dd/1/2]tpubDKETJ63aebYdrKgfJg1fAQXgiNX9WGC4YyAGU3o5F9xhqx3Q2Y2Qnn9d3LPG5wfajojW4PGmdcFJCGJaCL8mjcTAS2aD7uBS34zL5diACGD",
        obj.ToString(false, HardenedType::kSmallH).c_str());
  };

  KeyData obj2;
  try {
    obj2 = KeyData(key1);
    obj2 = obj2.DerivePubkey(path, true);
    check_func2(obj2, array2);
  } catch (const CfdException& e) {
    EXPECT_STREQ("", e.what());
  }
}